

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secant.c
# Opt level: O0

void qrupdate(double *R,int N,double *u,double *v)

{
  bool bVar1;
  int iVar2;
  double dVar3;
  int local_34;
  int l;
  int k;
  int j;
  int i;
  double *v_local;
  double *u_local;
  int N_local;
  double *R_local;
  
  for (k = 1; k < N; k = k + 1) {
    R[k * N + k + -1] = 0.0;
  }
  local_34 = N + -1;
  while( true ) {
    bVar1 = false;
    if ((u[local_34] == 0.0) && (!NAN(u[local_34]))) {
      bVar1 = 0 < local_34;
    }
    iVar2 = local_34;
    if (!bVar1) break;
    local_34 = local_34 + -1;
  }
  while (k = iVar2 + -1, -1 < k) {
    jrotate(R,N,u[k],-u[iVar2],k);
    if ((u[k] != 0.0) || (NAN(u[k]))) {
      dVar3 = sqrt(u[k] * u[k] + u[iVar2] * u[iVar2]);
      u[k] = dVar3;
      iVar2 = k;
    }
    else {
      u[k] = ABS(u[iVar2]);
      iVar2 = k;
    }
  }
  for (k = 0; k < N; k = k + 1) {
    R[k] = *u * v[k] + R[k];
  }
  for (k = 0; k < local_34; k = k + 1) {
    jrotate(R,N,R[k * N + k],-R[k * N + N + k],k);
  }
  return;
}

Assistant:

static void qrupdate(double *R,int N,double *u,double *v) {
	int i,j,k,l;
	
	for(i = 1; i < N;++i) {
		R[i*N+i-1] = 0;
	}
	
	k = N-1;
	while (u[k] == 0 && k > 0) {
		k--;
	}
	
	for (i = k-1; i >= 0;--i) {
		jrotate(R,N,u[i],-u[i+1],i);
		if (u[i] == 0) {
			u[i] = fabs(u[i+1]);
		} else {
			u[i] = sqrt(u[i]*u[i] + u[i+1]*u[i+1]);
		}
	}
	
	for(i = 0; i < N;++i) {
		R[i] += u[0] * v[i];
	}
	
	for(i = 0; i < k;++i) {
		j = i * N;
		l = j + N;
		jrotate(R,N,R[j+i],-R[l+i],i);
	}
}